

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecordSet.cpp
# Opt level: O0

void __thiscall KDIS::DATA_TYPE::RecordSet::~RecordSet(RecordSet *this)

{
  RecordSet *this_local;
  
  (this->super_DataTypeBase)._vptr_DataTypeBase = (_func_int **)&PTR__RecordSet_00332698;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::clear(&this->m_vui8RecVals);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&this->m_vui8RecVals);
  DataTypeBase::~DataTypeBase(&this->super_DataTypeBase);
  return;
}

Assistant:

RecordSet::~RecordSet()
{
    m_vui8RecVals.clear();
}